

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_ir.c
# Opt level: O0

int lj_ir_strcmp(GCstr *a,GCstr *b,IROp op)

{
  int32_t iVar1;
  int res;
  IROp op_local;
  GCstr *b_local;
  GCstr *a_local;
  
  iVar1 = lj_str_cmp(a,b);
  switch(op) {
  case IR_LT:
    a_local._4_4_ = (uint)(iVar1 < 0);
    break;
  case IR_GE:
    a_local._4_4_ = (uint)(-1 < iVar1);
    break;
  case IR_LE:
    a_local._4_4_ = (uint)(iVar1 < 1);
    break;
  case IR_GT:
    a_local._4_4_ = (uint)(0 < iVar1);
    break;
  default:
    a_local._4_4_ = 0;
  }
  return a_local._4_4_;
}

Assistant:

int lj_ir_strcmp(GCstr *a, GCstr *b, IROp op)
{
  int res = lj_str_cmp(a, b);
  switch (op) {
  case IR_LT: return (res < 0);
  case IR_GE: return (res >= 0);
  case IR_LE: return (res <= 0);
  case IR_GT: return (res > 0);
  default: lj_assertX(0, "bad IR op %d", op); return 0;
  }
}